

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::RegExprNFAParseElement::ShiftToken
          (RegExprNFAParseElement *this,TokenType *token,
          TokenStream<SGParser::Generator::RegExprParseToken> *stream)

{
  uint uVar1;
  uint uVar2;
  undefined8 local_20;
  TokenType tok;
  
  uVar1 = token->ch;
  (this->field_1).ch = uVar1;
  if ((uVar1 == 0x5c) && ((token->super_TokenCode).Code != 1)) {
    local_20 = 1;
    (*stream->_vptr_TokenStream[2])(stream,&local_20);
    (this->field_1).ch = local_20._4_4_;
    uVar1 = local_20._4_4_ - 0x62 >> 1;
    uVar2 = uVar1 | (uint)((local_20._4_4_ - 0x62 & 1) != 0) << 0x1f;
    if ((uVar2 < 0xb) && ((0x745U >> (uVar1 & 0x1f) & 1) != 0)) {
      (this->field_1).ch = *(uint *)(&DAT_00144438 + (ulong)uVar2 * 4);
    }
  }
  return;
}

Assistant:

void ShiftToken(TokenType& token, TokenStream<TokenType>& stream) {
        ch = token.ch;
        // If we are shifting token, parser will be looking at the next character next
        // So we can do this
        // Essentially, we are ignoring the next token code, and turning it into a character
        if (ch == '\\' && token.Code != TokenCode::TokenEOF) {
            TokenType tok;
            stream.GetNextToken(tok);
            ch = tok.ch;
            // Process characters with special meanings
            switch (ch) {
                case 'n': ch = '\n'; break;
                case 't': ch = '\t'; break;
                case 'v': ch = '\v'; break;
                case 'r': ch = '\r'; break;
                case 'f': ch = '\f'; break;
                case 'b': ch = '\b'; break;
            }
        }
    }